

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O1

void flatbuffers::php::PhpGenerator::BuildFieldOfTable
               (FieldDef *field,size_t offset,string *code_ptr)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  FieldDef *extraout_RDX;
  FieldDef *extraout_RDX_00;
  FieldDef *extraout_RDX_01;
  FieldDef *field_00;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  string local_a0;
  allocator<char> local_79;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  size_t local_38;
  
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_c0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_c0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                       (ulong)(field->value).type.base_type * 8),&local_79);
  uVar6 = 0xf;
  if (local_78 != local_68) {
    uVar6 = local_68[0];
  }
  if (uVar6 < (ulong)(local_50 + local_70)) {
    uVar6 = 0xf;
    if (local_58 != local_48) {
      uVar6 = local_48[0];
    }
    if ((ulong)(local_50 + local_70) <= uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
      goto LAB_002729a8;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58);
LAB_002729a8:
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_a0.field_2._M_allocated_capacity = *psVar1;
    local_a0.field_2._8_8_ = puVar3[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar1;
    local_a0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_a0._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  local_38 = offset;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  paVar2 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_c0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_c0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_c0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  ConvertCase(&local_a0,(string *)field,kUpperCamel,kSnake);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x3792c4);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  ConvertCase(&local_a0,(string *)field,kLowerCamel,kSnake);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x3793c1);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_c0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  std::operator+(&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  field_00 = extraout_RDX;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
    field_00 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    field_00 = extraout_RDX_01;
  }
  GenMethod_abi_cxx11_(&local_a0,(PhpGenerator *)field,field_00);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>(&local_a0,local_38);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  ConvertCase(&local_a0,(string *)field,kLowerCamel,kSnake);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x3793c1);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  if ((field->value).type.base_type == BASE_TYPE_BOOL) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  else {
    std::__cxx11::string::_M_append
              ((char *)code_ptr,(ulong)(field->value).constant._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)code_ptr);
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_c0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  return;
}

Assistant:

static void BuildFieldOfTable(const FieldDef &field, const size_t offset,
                                std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += Indent + "/**\n";
    code += Indent + " * @param FlatBufferBuilder $builder\n";
    code += Indent + " * @param " + GenTypeBasic(field.value.type) + "\n";
    code += Indent + " * @return void\n";
    code += Indent + " */\n";
    code += Indent + "public static function ";
    code += "add" + ConvertCase(field.name, Case::kUpperCamel);
    code += "(FlatBufferBuilder $builder, ";
    code += "$" + ConvertCase(field.name, Case::kLowerCamel);
    code += ")\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$builder->add";
    code += GenMethod(field) + "X(";
    code += NumToString(offset) + ", ";

    code += "$" + ConvertCase(field.name, Case::kLowerCamel);
    code += ", ";

    if (field.value.type.base_type == BASE_TYPE_BOOL) {
      code += "false";
    } else {
      code += field.value.constant;
    }
    code += ");\n";
    code += Indent + "}\n\n";
  }